

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walBusyLock(Wal *pWal,_func_int_void_ptr *xBusy,void *pBusyArg,int lockIdx,int n)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int rc;
  int n_local;
  int lockIdx_local;
  void *pBusyArg_local;
  _func_int_void_ptr *xBusy_local;
  Wal *pWal_local;
  
  do {
    iVar1 = walLockExclusive(pWal,lockIdx,n);
    bVar3 = false;
    if ((xBusy != (_func_int_void_ptr *)0x0) && (bVar3 = false, iVar1 == 5)) {
      iVar2 = (*xBusy)(pBusyArg);
      bVar3 = iVar2 != 0;
    }
  } while (bVar3);
  return iVar1;
}

Assistant:

static int walBusyLock(
  Wal *pWal,                      /* WAL connection */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int lockIdx,                    /* Offset of first byte to lock */
  int n                           /* Number of bytes to lock */
){
  int rc;
  do {
    rc = walLockExclusive(pWal, lockIdx, n);
  }while( xBusy && rc==SQLITE_BUSY && xBusy(pBusyArg) );
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ){
    walDisableBlocking(pWal);
    rc = SQLITE_BUSY;
  }
#endif
  return rc;
}